

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void __thiscall duckdb::ParquetReader::~ParquetReader(ParquetReader *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false> __ptr;
  
  (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)&PTR__ParquetReader_004a5180;
  std::unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
  ~unique_ptr(&(this->file_handle).
               super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
             );
  p_Var1 = (this->encryption_util).internal.
           super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  __ptr._M_head_impl =
       (this->root_schema).
       super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
       .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (ParquetColumnSchema *)0x0) {
    std::default_delete<duckdb::ParquetColumnSchema>::operator()
              ((default_delete<duckdb::ParquetColumnSchema> *)&this->root_schema,__ptr._M_head_impl)
    ;
  }
  (this->root_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&(this->parquet_options).schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  p_Var1 = (this->parquet_options).encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->metadata).internal.
           super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  duckdb::CachingFileSystem::~CachingFileSystem(&this->fs);
  BaseFileReader::~BaseFileReader(&this->super_BaseFileReader);
  return;
}

Assistant:

ParquetReader::~ParquetReader() {
}